

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

void __thiscall ON_XMLVariantPrivate::ClearBuffers(ON_XMLVariantPrivate *this)

{
  ON_Buffer *this_00;
  
  this_00 = this->_buffer;
  if (this_00 != (ON_Buffer *)0x0) {
    ON_Buffer::~ON_Buffer(this_00);
    operator_delete(this_00,0x40);
    this->_buffer = (ON_Buffer *)0x0;
  }
  if (this->_raw_buffer != (ON__UINT8 *)0x0) {
    operator_delete__(this->_raw_buffer);
    this->_raw_buffer = (ON__UINT8 *)0x0;
  }
  return;
}

Assistant:

void ClearBuffers(void)
  {
    if (nullptr != _buffer)
    {
      delete _buffer;
      _buffer = nullptr;
    }

    if (nullptr != _raw_buffer)
    {
      delete[] _raw_buffer;
      _raw_buffer = nullptr;
    }
  }